

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O1

void amrex::VisMF::FindOffsets
               (FabArray<amrex::FArrayBox> *mf,string *filePrefix,Header *hdr,Version param_4,
               NFilesIter *nfi,MPI_Comm comm)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  pointer pBVar3;
  pointer pBVar4;
  iterator __position;
  pointer pVVar5;
  pointer pVVar6;
  pointer piVar7;
  _Base_ptr p_Var8;
  Format FVar9;
  int iVar10;
  FABio *pFVar11;
  long lVar12;
  vector<int,std::allocator<int>> *this;
  pointer piVar13;
  _Base_ptr p_Var14;
  long lVar15;
  NFilesIter *pNVar16;
  int iVar17;
  long lVar18;
  _Rb_tree_header *p_Var19;
  unique_ptr<amrex::RealDescriptor,_std::default_delete<amrex::RealDescriptor>_> whichRD;
  string whichFileName;
  FArrayBox tempFab;
  Vector<long,_std::allocator<long>_> currentOffset;
  Vector<long,_std::allocator<long>_> fabHeaderBytes;
  map<int,_amrex::Vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<int,_std::allocator<int>_>_>_>_>
  rankBoxOrder;
  RealDescriptor *local_2c0;
  vector<int,_std::allocator<int>_> local_2b8;
  long local_298;
  long local_290;
  undefined1 *local_288;
  undefined8 local_280;
  undefined1 local_278;
  undefined7 uStack_277;
  undefined1 local_268 [52];
  uint local_234;
  NFilesIter *local_220;
  string local_218;
  vector<long,_std::allocator<long>_> local_1f8;
  vector<long,_std::allocator<long>_> local_1e0;
  long local_1c8;
  string *local_1c0;
  _Rb_tree<int,_std::pair<const_int,_amrex::Vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_amrex::Vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<int,_std::allocator<int>_>_>_>_>
  local_1b8 [2];
  ios_base local_138 [264];
  
  iVar17 = 0;
  if (nfi->useStaticSetSelection == false) {
    iVar17 = nfi->coordinatorProc;
  }
  local_1c0 = filePrefix;
  FVar9 = FArrayBox::getFormat();
  if ((FVar9 != FAB_ASCII) && (FVar9 = FArrayBox::getFormat(), FVar9 != FAB_8BIT)) {
    FArrayBox::getDataDescriptor();
    pFVar11 = FArrayBox::getFABio();
    iVar10 = RealDescriptor::numBytes(local_2c0);
    if (iVar17 == 0) {
      local_290 = CONCAT44(local_290._4_4_,iVar10);
      local_298 = (long)(mf->super_FabArrayBase).n_comp;
      peVar2 = (mf->super_FabArrayBase).boxarray.m_ref.
               super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_1b8[0]._M_impl._0_8_ = 0;
      local_220 = nfi;
      std::vector<long,_std::allocator<long>_>::vector
                (&local_1e0,
                 ((long)(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  *(long *)&(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data >> 2) * 0x6db6db6db6db6db7,
                 (value_type_conflict3 *)local_1b8,(allocator_type *)local_268);
      local_288 = &local_278;
      local_280 = 0;
      local_278 = 0;
      local_1b8[0]._M_impl._0_8_ = 0;
      std::vector<long,_std::allocator<long>_>::vector
                (&local_1f8,1,(value_type_conflict3 *)local_1b8,(allocator_type *)local_268);
      if ((hdr->m_vers == 1) &&
         (peVar2 = (mf->super_FabArrayBase).boxarray.m_ref.
                   super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
         0 < (long)(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             *(long *)&(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                       super__Vector_impl_data)) {
        lVar18 = 0;
        do {
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          FabArrayBase::fabbox((Box *)&local_218,&mf->super_FabArrayBase,(int)lVar18);
          FArrayBox::FArrayBox
                    ((FArrayBox *)local_268,(Box *)&local_218,(int)local_298,false,false,
                     (Arena *)0x0);
          (*pFVar11->_vptr_FABio[6])
                    (pFVar11,&local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_parent,
                     (BaseFab<double> *)local_268,(ulong)local_234);
          lVar12 = std::ostream::tellp();
          local_1e0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar18] = lVar12;
          local_268._0_8_ = &PTR__BaseFab_00837b90;
          BaseFab<double>::clear((BaseFab<double> *)local_268);
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base(local_138);
          peVar2 = (mf->super_FabArrayBase).boxarray.m_ref.
                   super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          lVar18 = lVar18 + 1;
          lVar12 = ((long)(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    *(long *)&(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                              .super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data >> 2) * 0x6db6db6db6db6db7;
        } while (lVar12 - lVar18 != 0 && lVar18 <= lVar12);
      }
      local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_1b8[0]._M_impl.super__Rb_tree_header._M_header;
      local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_1b8[0]._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_268._0_8_ = local_268._0_8_ & 0xffffffff00000000;
      peVar2 = (mf->super_FabArrayBase).boxarray.m_ref.
               super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pBVar3 = (peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pBVar4 = (peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_right =
           local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_left;
      if (pBVar3 != pBVar4 && -1 < (long)pBVar3 - (long)pBVar4) {
        lVar18 = 0;
        do {
          local_218._M_dataplus._M_p._0_4_ =
               *(undefined4 *)
                (*(long *)&(((mf->super_FabArrayBase).distributionMap.m_ref.
                             super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->m_pmap).super_vector<int,_std::allocator<int>_>.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl + lVar18 * 4);
          this = (vector<int,std::allocator<int>> *)
                 std::
                 map<int,_amrex::Vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<int,_std::allocator<int>_>_>_>_>
                 ::operator[]((map<int,_amrex::Vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<int,_std::allocator<int>_>_>_>_>
                               *)local_1b8,(key_type *)&local_218);
          __position._M_current = *(int **)(this + 8);
          if (__position._M_current == *(int **)(this + 0x10)) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (this,__position,(int *)local_268);
          }
          else {
            *__position._M_current = local_268._0_4_;
            *(int **)(this + 8) = __position._M_current + 1;
          }
          lVar18 = (long)(int)local_268._0_4_ + 1;
          local_268._0_4_ = (int)lVar18;
          peVar2 = (mf->super_FabArrayBase).boxarray.m_ref.
                   super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          lVar12 = ((long)(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    *(long *)&(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                              .super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data >> 2) * 0x6db6db6db6db6db7;
        } while (lVar12 - lVar18 != 0 && lVar18 <= lVar12);
      }
      pNVar16 = local_220;
      local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if (local_220->useStaticSetSelection == false) {
        NFilesIter::FileNumbersWritten((Vector<int,_std::allocator<int>_> *)local_268,local_220);
        piVar7 = local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        piVar13 = local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)local_268._0_8_;
        local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)local_268._8_8_;
        local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)local_268._16_8_;
        local_268._0_8_ = (_func_int **)0x0;
        local_268._8_8_ = (Arena *)0x0;
        local_268._16_8_ = (double *)0x0;
        if ((_func_int **)piVar13 != (_func_int **)0x0) {
          operator_delete(piVar13,(long)piVar7 - (long)piVar13);
        }
        if ((_func_int **)local_268._0_8_ != (_func_int **)0x0) {
          operator_delete((void *)local_268._0_8_,local_268._16_8_ - local_268._0_8_);
        }
      }
      else {
        if (local_220->useSparseFPP == true) {
          std::vector<int,_std::allocator<int>_>::resize(&local_2b8,1);
        }
        else {
          std::vector<int,_std::allocator<int>_>::resize(&local_2b8,1);
        }
        *local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start = 0;
      }
      pVVar5 = (pNVar16->fileNumbersWriteOrder).
               super_vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
               .
               super__Vector_base<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pVVar6 = (pNVar16->fileNumbersWriteOrder).
               super_vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
               .
               super__Vector_base<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pVVar5 != pVVar6 && -1 < (long)pVVar5 - (long)pVVar6) {
        local_298 = local_298 * (int)local_290;
        lVar18 = 0;
        do {
          pVVar5 = (pNVar16->fileNumbersWriteOrder).
                   super_vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
                   .
                   super__Vector_base<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_290 = lVar18 * 3;
          piVar13 = *(pointer *)
                     &pVVar5[lVar18].super_vector<int,_std::allocator<int>_>.
                      super__Vector_base<int,_std::allocator<int>_>;
          piVar7 = pVVar5[lVar18].super_vector<int,_std::allocator<int>_>.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_finish;
          local_1c8 = lVar18;
          if (piVar7 != piVar13 && -1 < (long)piVar7 - (long)piVar13) {
            lVar18 = 0;
            do {
              iVar17 = piVar13[lVar18];
              p_Var1 = &local_1b8[0]._M_impl.super__Rb_tree_header;
              p_Var14 = &p_Var1->_M_header;
              for (p_Var8 = local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_parent;
                  (_Rb_tree_header *)p_Var8 != (_Rb_tree_header *)0x0;
                  p_Var8 = (&p_Var8->_M_left)[(int)*(size_t *)(p_Var8 + 1) < iVar17]) {
                if (iVar17 <= (int)*(size_t *)(p_Var8 + 1)) {
                  p_Var14 = p_Var8;
                }
              }
              p_Var19 = p_Var1;
              if (((_Rb_tree_header *)p_Var14 != p_Var1) &&
                 (p_Var19 = (_Rb_tree_header *)p_Var14,
                 iVar17 < (int)((_Rb_tree_header *)p_Var14)->_M_node_count)) {
                p_Var19 = p_Var1;
              }
              if (p_Var19 != p_Var1) {
                iVar17 = *(int *)((long)local_2b8.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start + (long)iVar17 * 4)
                ;
                Concatenate(&local_218,local_1c0,iVar17,NFilesIter::minDigits);
                BaseName((string *)local_268,&local_218);
                std::__cxx11::string::operator=((string *)&local_288,(string *)local_268);
                if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
                  operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_218._M_dataplus._M_p._4_4_,local_218._M_dataplus._M_p._0_4_)
                    != &local_218.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT44(local_218._M_dataplus._M_p._4_4_,
                                           local_218._M_dataplus._M_p._0_4_),
                                  local_218.field_2._M_allocated_capacity + 1);
                }
                lVar12 = *(long *)(p_Var19 + 1);
                if (*(long *)((long)(p_Var19 + 1) + 8) != lVar12 &&
                    -1 < *(long *)((long)(p_Var19 + 1) + 8) - lVar12) {
                  lVar15 = 0;
                  do {
                    std::__cxx11::string::_M_assign
                              ((string *)
                               ((hdr->m_fod).
                                super_vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>
                                .
                                super__Vector_base<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>
                                ._M_impl.super__Vector_impl_data._M_start +
                               *(int *)(lVar12 + lVar15 * 4)));
                    lVar12 = *(long *)(p_Var19 + 1);
                    (hdr->m_fod).
                    super_vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>.
                    super__Vector_base<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>
                    ._M_impl.super__Vector_impl_data._M_start[*(int *)(lVar12 + lVar15 * 4)].m_head
                         = local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar17];
                    FabArrayBase::fabbox
                              ((Box *)local_268,&mf->super_FabArrayBase,
                               *(int *)(lVar12 + lVar15 * 4));
                    local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar17] =
                         local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar17] +
                         (long)((local_268._20_4_ - local_268._8_4_) + 1) *
                         (long)((local_268._16_4_ - local_268._4_4_) + 1) *
                         ((local_268._12_4_ - local_268._0_4_) + 1) * local_298 +
                         local_1e0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_start
                         [*(int *)(*(long *)(p_Var19 + 1) + lVar15 * 4)];
                    lVar15 = lVar15 + 1;
                    lVar12 = *(long *)(p_Var19 + 1);
                  } while (lVar15 < *(long *)((long)(p_Var19 + 1) + 8) - lVar12 >> 2);
                }
              }
              lVar18 = lVar18 + 1;
              pVVar5 = (local_220->fileNumbersWriteOrder).
                       super_vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
                       .
                       super__Vector_base<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              piVar13 = (&(pVVar5->super_vector<int,_std::allocator<int>_>).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start)[local_290];
              pNVar16 = local_220;
            } while (lVar18 < (long)(&(pVVar5->super_vector<int,_std::allocator<int>_>).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish)[local_290] - (long)piVar13
                              >> 2);
          }
          lVar18 = local_1c8 + 1;
          lVar12 = ((long)(pNVar16->fileNumbersWriteOrder).
                          super_vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
                          .
                          super__Vector_base<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pNVar16->fileNumbersWriteOrder).
                          super_vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
                          .
                          super__Vector_base<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        } while (lVar12 - lVar18 != 0 && lVar18 <= lVar12);
      }
      if ((_func_int **)
          local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (_func_int **)0x0) {
        operator_delete(local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_amrex::Vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_amrex::Vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<int,_std::allocator<int>_>_>_>_>
      ::~_Rb_tree(local_1b8);
      if (local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_288 != &local_278) {
        operator_delete(local_288,CONCAT71(uStack_277,local_278) + 1);
      }
      if (local_1e0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_1e0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1e0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1e0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    if (local_2c0 != (RealDescriptor *)0x0) {
      std::default_delete<amrex::RealDescriptor>::operator()
                ((default_delete<amrex::RealDescriptor> *)&local_2c0,local_2c0);
    }
  }
  return;
}

Assistant:

void
VisMF::FindOffsets (const FabArray<FArrayBox> &mf,
                    const std::string &filePrefix,
                    VisMF::Header &hdr,
                    VisMF::Header::Version /*whichVersion*/,
                    NFilesIter &nfi, MPI_Comm comm)
{
//    BL_PROFILE("VisMF::FindOffsets");

    const int myProc(ParallelDescriptor::MyProc(comm));
    const int nProcs(ParallelDescriptor::NProcs(comm));
    int coordinatorProc(ParallelDescriptor::IOProcessorNumber(comm));
    if(nfi.GetDynamic()) {
      coordinatorProc = nfi.CoordinatorProc();
    }

    if(FArrayBox::getFormat() == FABio::FAB_ASCII ||
       FArrayBox::getFormat() == FABio::FAB_8BIT)
    {

#ifdef BL_USE_MPI
    Vector<int> nmtags(nProcs,0);
    Vector<int> offset(nProcs,0);

    const Vector<int> &pmap = mf.DistributionMap().ProcessorMap();

    for(int i(0), N(mf.size()); i < N; ++i) {
        ++nmtags[pmap[i]];
    }

    for(int i(1), N(offset.size()); i < N; ++i) {
        offset[i] = offset[i-1] + nmtags[i-1];
    }

    Vector<Long> senddata(nmtags[myProc]);

    if(senddata.empty()) {
      // Can't let senddata be empty as senddata.dataPtr() will fail.
      senddata.resize(1);
    }

    int ioffset(0);

    for(MFIter mfi(mf); mfi.isValid(); ++mfi) {
      senddata[ioffset++] = hdr.m_fod[mfi.index()].m_head;
    }

    BL_ASSERT(ioffset == nmtags[myProc]);

    Vector<Long> recvdata(mf.size());

    BL_COMM_PROFILE(BLProfiler::Gatherv, recvdata.size() * sizeof(Long),
                    myProc, BLProfiler::BeforeCall());

    BL_MPI_REQUIRE( MPI_Gatherv(senddata.dataPtr(),
                                nmtags[myProc],
                                ParallelDescriptor::Mpi_typemap<Long>::type(),
                                recvdata.dataPtr(),
                                nmtags.dataPtr(),
                                offset.dataPtr(),
                                ParallelDescriptor::Mpi_typemap<Long>::type(),
                                coordinatorProc,
                                comm) );

    BL_COMM_PROFILE(BLProfiler::Gatherv, recvdata.size() * sizeof(Long),
                    myProc, BLProfiler::AfterCall());

    if(myProc == coordinatorProc) {
        Vector<int> cnt(nProcs,0);

        for(int j(0), N(mf.size()); j < N; ++j) {
            const int i(pmap[j]);
            hdr.m_fod[j].m_head = recvdata[offset[i]+cnt[i]];

            const std::string name(NFilesIter::FileName(nOutFiles, filePrefix, i, groupSets));

            hdr.m_fod[j].m_name = VisMF::BaseName(name);

            ++cnt[i];
        }
    }
#endif /*BL_USE_MPI*/


    } else {    // ---- calculate offsets

      auto whichRD = FArrayBox::getDataDescriptor();
      const FABio &fio = FArrayBox::getFABio();
      int whichRDBytes(whichRD->numBytes());
      int nComps(mf.nComp());

      if(myProc == coordinatorProc) {   // ---- calculate offsets
        const BoxArray &mfBA = mf.boxArray();
        const DistributionMapping &mfDM = mf.DistributionMap();
        Vector<Long> fabHeaderBytes(mfBA.size(), 0);
        int nFiles(NFilesIter::ActualNFiles(nOutFiles));
        int whichFileNumber(-1);
        std::string whichFileName;
        Vector<Long> currentOffset(nProcs, 0L);

        if(hdr.m_vers == VisMF::Header::Version_v1) {
          // ---- find the length of the fab header instead of asking the file system
          for(int i(0); i < mfBA.size(); ++i) {
            std::stringstream hss;
            FArrayBox tempFab(mf.fabbox(i), nComps, false);  // ---- no alloc
            fio.write_header(hss, tempFab, tempFab.nComp());
            fabHeaderBytes[i] = static_cast<std::streamoff>(hss.tellp());
          }
        }

        std::map<int, Vector<int> > rankBoxOrder;  // ---- [rank, boxarray index array]
        for(int i(0); i < mfBA.size(); ++i) {
          rankBoxOrder[mfDM[i]].push_back(i);
        }

        Vector<int> fileNumbers;
        if(nfi.GetDynamic()) {
          fileNumbers = nfi.FileNumbersWritten();
        }
        else if(nfi.GetSparseFPP()) {        // if sparse, write to (file number = rank)
          fileNumbers.resize(nProcs);
          for(int i(0); i < nProcs; ++i) {
            fileNumbers[i] = i;
          }
        }
        else {
          fileNumbers.resize(nProcs);
          for(int i(0); i < nProcs; ++i) {
            fileNumbers[i] = NFilesIter::FileNumber(nFiles, i, groupSets);
          }
        }

        const Vector< Vector<int> > &fileNumbersWriteOrder = nfi.FileNumbersWriteOrder();

        for(int fn(0); fn < fileNumbersWriteOrder.size(); ++fn) {
          for(int ri(0); ri < fileNumbersWriteOrder[fn].size(); ++ri) {
            int rank(fileNumbersWriteOrder[fn][ri]);
            std::map<int, Vector<int> >::iterator rboIter = rankBoxOrder.find(rank);

            if(rboIter != rankBoxOrder.end()) {
              Vector<int> &index = rboIter->second;
              whichFileNumber = fileNumbers[rank];
              whichFileName   = VisMF::BaseName(NFilesIter::FileName(whichFileNumber, filePrefix));

              for(int i(0); i < index.size(); ++i) {
                 hdr.m_fod[index[i]].m_name = whichFileName;
                 hdr.m_fod[index[i]].m_head = currentOffset[whichFileNumber];
                 currentOffset[whichFileNumber] += mf.fabbox(index[i]).numPts() * nComps * whichRDBytes
                                                   + fabHeaderBytes[index[i]];
              }
            }
          }
        }
      }
    }
}